

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_string(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,char *value)

{
  int iVar1;
  size_t length_00;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  _Bool use_smallest;
  size_t length;
  int result;
  char *value_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  length_00 = strlen(value);
  iVar1 = encode_string_constructor(encoder_output,context,length_00 < 0x100);
  if ((iVar1 == 0) &&
     (iVar1 = encode_string_value(encoder_output,context,value,length_00,length_00 < 0x100),
     iVar1 == 0)) {
    return 0;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
              ,"encode_string",0xe02,1,"Failed encoding string");
  }
  return 0xe03;
}

Assistant:

static int encode_string(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, const char* value)
{
    int result;
    size_t length = strlen(value);
    bool use_smallest = (length <= 255);

    if ((encode_string_constructor(encoder_output, context, use_smallest) != 0) ||
        (encode_string_value(encoder_output, context, value, length, use_smallest) != 0))
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failed encoding string");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}